

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O0

HeapArray * __thiscall
jsonnet::internal::(anonymous_namespace)::Heap::
makeEntity<jsonnet::internal::(anonymous_namespace)::HeapArray,std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>const&>
          (Heap *this,
          vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          *args)

{
  HeapArray *elements;
  pointer ppHVar1;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *in_RDI;
  HeapArray *r;
  value_type *in_stack_ffffffffffffffb8;
  HeapArray *in_stack_ffffffffffffffd0;
  
  elements = (HeapArray *)operator_new(0x28);
  anon_unknown_0::HeapArray::HeapArray
            (in_stack_ffffffffffffffd0,
             (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              *)elements);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back(in_RDI,in_stack_ffffffffffffffb8);
  *(undefined1 *)
   &(((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
       *)&elements->super_HeapEntity)->_M_impl).super__Vector_impl_data._M_finish =
       *(undefined1 *)
        &(in_RDI->
         super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppHVar1 = (pointer)std::
                     vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                     ::size(in_RDI + 1);
  in_RDI[2].
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppHVar1;
  return elements;
}

Assistant:

T *makeEntity(Args &&... args)
    {
        T *r = new T(std::forward<Args>(args)...);
        entities.push_back(r);
        r->mark = lastMark;
        numEntities = entities.size();
        return r;
    }